

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_get_token(char **ptr,char *delimiter,char *token,int *isanumber)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *piVar4;
  double dval;
  char local_88 [4];
  int slen;
  char tval [73];
  char *local_30;
  char *loc;
  int *isanumber_local;
  char *token_local;
  char *delimiter_local;
  char **ptr_local;
  
  *token = '\0';
  while (**ptr == ' ') {
    *ptr = *ptr + 1;
  }
  loc = (char *)isanumber;
  isanumber_local = (int *)token;
  token_local = delimiter;
  delimiter_local = (char *)ptr;
  sVar2 = strcspn(*ptr,delimiter);
  iVar1 = (int)sVar2;
  if (iVar1 != 0) {
    strncat((char *)isanumber_local,*(char **)delimiter_local,(long)iVar1);
    *(long *)delimiter_local = *(long *)delimiter_local + (long)iVar1;
    if (loc != (char *)0x0) {
      loc[0] = '\x01';
      loc[1] = '\0';
      loc[2] = '\0';
      loc[3] = '\0';
      pcVar3 = strchr((char *)isanumber_local,0x44);
      if (pcVar3 == (char *)0x0) {
        strtod((char *)isanumber_local,&local_30);
      }
      else {
        strncpy(local_88,(char *)isanumber_local,0x48);
        tval[0x40] = '\0';
        local_30 = strchr(local_88,0x44);
        if (local_30 != (char *)0x0) {
          *local_30 = 'E';
        }
        strtod(local_88,&local_30);
      }
      if ((*local_30 != '\0') && (*local_30 != ' ')) {
        loc[0] = '\0';
        loc[1] = '\0';
        loc[2] = '\0';
        loc[3] = '\0';
      }
      piVar4 = __errno_location();
      if (*piVar4 == 0x22) {
        loc[0] = '\0';
        loc[1] = '\0';
        loc[2] = '\0';
        loc[3] = '\0';
      }
    }
  }
  return iVar1;
}

Assistant:

int fits_get_token(char **ptr, 
                   char *delimiter,
                   char *token,
                   int *isanumber)   /* O - is this token a number? */
/*
   parse off the next token, delimited by a character in 'delimiter',
   from the input ptr string;  increment *ptr to the end of the token.
   Returns the length of the token, not including the delimiter char;
*/
{
    char *loc, tval[73];
    int slen;
    double dval;
    
    *token = '\0';

    while (**ptr == ' ')  /* skip over leading blanks */
        (*ptr)++;

    slen = strcspn(*ptr, delimiter);  /* length of next token */
    if (slen)
    {
        strncat(token, *ptr, slen);       /* copy token */

        (*ptr) += slen;                   /* skip over the token */

        if (isanumber)  /* check if token is a number */
        {
            *isanumber = 1;

	    if (strchr(token, 'D'))  {
	        strncpy(tval, token, 72);
		tval[72] = '\0';

	        /*  The C language does not support a 'D'; replace with 'E' */
	        if ((loc = strchr(tval, 'D'))) *loc = 'E';

	        dval =  strtod(tval, &loc);
	    } else {
	        dval =  strtod(token, &loc);
 	    }

	    /* check for read error, or junk following the value */
	    if (*loc != '\0' && *loc != ' ' ) *isanumber = 0;
	    if (errno == ERANGE) *isanumber = 0;
        }
    }

    return(slen);
}